

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeViewPrivate::expand(QTreeViewPrivate *this,int item,bool emitSignal)

{
  State SVar1;
  QTreeViewItem *pQVar2;
  QAbstractItemView *this_00;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_01;
  QAbstractItemModel *pQVar3;
  char cVar4;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar5;
  pointer pQVar6;
  long in_FS_OFFSET;
  QModelIndex local_68;
  QHashDummyValue local_49;
  QPersistentModelIndex local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == -1) goto LAB_005a9d21;
  pQVar2 = (this->viewItems).d.ptr;
  if ((pQVar2[item].field_0x1c & 1) != 0) goto LAB_005a9d21;
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar2 = pQVar2 + item;
  local_68.r = (pQVar2->index).r;
  local_68.c = (pQVar2->index).c;
  local_68.i = (pQVar2->index).i;
  local_68.m.ptr = (pQVar2->index).m.ptr;
  if (local_68.m.ptr != (QAbstractItemModel *)0x0) {
    cVar4 = (**(code **)(*(long *)local_68.m.ptr + 0x138))(local_68.m.ptr,&local_68);
    if (cVar4 < '\0') goto LAB_005a9d21;
  }
  if ((emitSignal) && (this->animationsEnabled == true)) {
    prepareAnimatedOperation(this,item,Forward);
  }
  SVar1 = (this->super_QAbstractItemViewPrivate).state;
  if (SVar1 != AnimatingState) {
    (this->super_QAbstractItemViewPrivate).stateBeforeAnimation = SVar1;
  }
  QAbstractItemView::setState(this_00,ExpandingState);
  QPersistentModelIndex::QPersistentModelIndex(&local_48,&local_68);
  this_01 = (this->expandedIndexes).q_hash.d;
  if (this_01 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
LAB_005a9c60:
    QHash<QPersistentModelIndex,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QPersistentModelIndex,QHashDummyValue> *)&this->expandedIndexes,&local_48,
               &local_49);
  }
  else {
    pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
             findNode<QPersistentModelIndex>(this_01,&local_48);
    if (pNVar5 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) goto LAB_005a9c60;
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_48);
  pQVar6 = QList<QTreeViewItem>::data(&this->viewItems);
  pQVar6[item].field_0x1c = pQVar6[item].field_0x1c | 1;
  layout(this,item,false,false);
  QAbstractItemView::setState(this_00,(this->super_QAbstractItemViewPrivate).stateBeforeAnimation);
  pQVar3 = (this->super_QAbstractItemViewPrivate).model;
  cVar4 = (**(code **)(*(long *)pQVar3 + 0x130))(pQVar3,&local_68);
  if (cVar4 != '\0') {
    pQVar3 = (this->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar3 + 0x128))(pQVar3,&local_68);
  }
  if (emitSignal) {
    local_48.d = (QPersistentModelIndexData *)0x0;
    puStack_40 = (undefined1 *)&local_68;
    QMetaObject::activate((QObject *)this_00,&QTreeView::staticMetaObject,0,&local_48.d);
    if (this->animationsEnabled == true) {
      beginAnimatedOperation(this);
    }
  }
  updateAccessibility(this);
LAB_005a9d21:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::expand(int item, bool emitSignal)
{
    Q_Q(QTreeView);

    if (item == -1 || viewItems.at(item).expanded)
        return;
    const QModelIndex index = viewItems.at(item).index;
    if (index.flags() & Qt::ItemNeverHasChildren)
        return;

#if QT_CONFIG(animation)
    if (emitSignal && animationsEnabled)
        prepareAnimatedOperation(item, QVariantAnimation::Forward);
#endif // animation
     //if already animating, stateBeforeAnimation is set to the correct value
    if (state != QAbstractItemView::AnimatingState)
        stateBeforeAnimation = state;
    q->setState(QAbstractItemView::ExpandingState);
    storeExpanded(index);
    viewItems[item].expanded = true;
    layout(item);
    q->setState(stateBeforeAnimation);

    if (model->canFetchMore(index))
        model->fetchMore(index);
    if (emitSignal) {
        emit q->expanded(index);
#if QT_CONFIG(animation)
        if (animationsEnabled)
            beginAnimatedOperation();
#endif // animation
    }
    updateAccessibility();
}